

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

void find_cost_range(cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float delta,
                    float eta,float *min_pred,float *max_pred,bool *is_range_large)

{
  bool bVar1;
  float *pfVar2;
  ostream *poVar3;
  void *pvVar4;
  uint in_ECX;
  long in_RDX;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar5;
  float in_XMM1_Da;
  undefined1 *in_stack_00000008;
  float sens;
  float tol;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  float tol_00;
  
  tol_00 = 1e-06;
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(0x358637bd,in_stack_ffffffffffffffc0),
             (example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  fVar5 = LEARNER::learner<char,_example>::sensitivity
                    ((learner<char,_example> *)CONCAT44(tol_00,in_stack_ffffffffffffffc0),
                     (example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (((*(ulong *)(in_RDI + 0x18) < 2) || (bVar1 = nanpattern(0.0), bVar1)) ||
     (bVar1 = infpattern(0.0), bVar1)) {
    *in_R8 = *(float *)(in_RDI + 0xc);
    *in_R9 = *(float *)(in_RDI + 8);
    *in_stack_00000008 = 1;
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"  find_cost_rangeA: i=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ECX);
      poVar3 = std::operator<<(poVar3," pp=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)(in_RDX + 0x68a8));
      poVar3 = std::operator<<(poVar3," sens=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," eta=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_XMM1_Da);
      poVar3 = std::operator<<(poVar3," [");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_R8);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_R9);
      poVar3 = std::operator<<(poVar3,"] = ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*in_R9 - *in_R8);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    binarySearch(SUB84(in_R8,0),(float)((ulong)in_R9 >> 0x20),SUB84(in_R9,0),tol_00);
    pfVar2 = std::min<float>((float *)&stack0xffffffffffffffbc,(float *)(in_RDI + 8));
    *in_R9 = *pfVar2;
    binarySearch(SUB84(in_R8,0),(float)((ulong)in_R9 >> 0x20),SUB84(in_R9,0),tol_00);
    pfVar2 = std::max<float>((float *)&stack0xffffffffffffffb8,(float *)(in_RDI + 0xc));
    *in_R8 = *pfVar2;
    *in_stack_00000008 = in_XMM1_Da < *in_R9 - *in_R8;
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"  find_cost_rangeB: i=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ECX);
      poVar3 = std::operator<<(poVar3," pp=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)(in_RDX + 0x68a8));
      poVar3 = std::operator<<(poVar3," sens=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      poVar3 = std::operator<<(poVar3," eta=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_XMM1_Da);
      poVar3 = std::operator<<(poVar3," [");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_R8);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_R9);
      poVar3 = std::operator<<(poVar3,"] = ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*in_R9 - *in_R8);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

inline void find_cost_range(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float delta, float eta,
    float& min_pred, float& max_pred, bool& is_range_large)
{
  float tol = 1e-6f;

  base.predict(ec, i - 1);
  float sens = base.sensitivity(ec, i - 1);

  if (cs_a.t <= 1 || nanpattern(sens) || infpattern(sens))
  {
    min_pred = cs_a.cost_min;
    max_pred = cs_a.cost_max;
    is_range_large = true;
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeA: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
  else
  {
    // finding max_pred and min_pred by binary search
    max_pred =
        min(ec.pred.scalar + sens * binarySearch(cs_a.cost_max - ec.pred.scalar, delta, sens, tol), cs_a.cost_max);
    min_pred =
        max(ec.pred.scalar - sens * binarySearch(ec.pred.scalar - cs_a.cost_min, delta, sens, tol), cs_a.cost_min);
    is_range_large = (max_pred - min_pred > eta);
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeB: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
}